

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O1

void __thiscall Image_CopyRectIn_Test::TestBody(Image_CopyRectIn_Test *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  Allocator alloc;
  Tuple2<pbrt::Point2,_int> TVar7;
  byte bVar8;
  uint nc;
  Float *pFVar9;
  char *pcVar10;
  ulong uVar11;
  Point2i p;
  int c;
  long lVar12;
  uint uVar13;
  float *pfVar14;
  pointer pfVar15;
  int x;
  undefined1 auVar16 [16];
  Float FVar17;
  undefined1 in_ZMM3 [64];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_float> buf_00;
  Bounds2i extent;
  Float qv;
  AssertionResult gtest_ar;
  vector<float,_std::allocator<float>_> buf;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> orig;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  channelNames;
  Image image;
  AssertHelper local_230;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  Tuple2<pbrt::Point2,_int> local_218;
  uint local_20c;
  Bounds2i local_208;
  Float local_1f8 [3];
  PixelFormat local_1ec;
  string local_1e8;
  ulong local_1c8;
  Tuple2<pbrt::Point2,_int> local_1c0;
  vector<float,_std::allocator<float>_> local_1b8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_1a0;
  long local_180;
  ColorEncodingHandle local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  PixelFormat local_154 [3];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_148 [2];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  polymorphic_allocator<unsigned_char> local_90;
  uchar *local_88;
  size_t local_80;
  size_t local_78;
  polymorphic_allocator<pbrt::Half> local_70;
  Half *local_68;
  size_t local_60;
  size_t local_58;
  polymorphic_allocator<float> local_50;
  float *local_48;
  size_t local_40;
  size_t local_38;
  
  local_154[0] = U256;
  local_154[1] = Half;
  local_154[2] = 2;
  uVar11 = 0x853c49e6748fea9b;
  local_180 = 0;
  do {
    local_1ec = *(PixelFormat *)((long)local_154 + local_180);
    local_20c = 0;
    nc = 1;
    do {
      GetFloatPixels(&local_1a0,(Point2i)0x2000000011,nc);
      local_148[0] = &local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"A","");
      __l._M_len = 1;
      __l._M_array = (iterator)local_148;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_170,__l,(allocator_type *)&local_1e8);
      if (local_148[0] != &local_138) {
        operator_delete(local_148[0],
                        (ulong)((long)&(local_138.alloc.memoryResource)->_vptr_memory_resource + 1))
        ;
      }
      uVar13 = local_20c;
      if (1 < nc) {
        do {
          local_148[0] = &local_138;
          std::__cxx11::string::_M_construct((ulong)local_148,'\x01');
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_170
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148
                    );
          if (local_148[0] != &local_138) {
            operator_delete(local_148[0],
                            (ulong)((long)&(local_138.alloc.memoryResource)->_vptr_memory_resource +
                                   1));
          }
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      pbVar4 = local_170.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = (long)local_170.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_170.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      local_178.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )pbrt::ColorEncodingHandle::Linear.bits;
      local_1c8 = uVar11;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = lVar12 >> 5;
      channels.ptr = pbVar4;
      pbrt::Image::Image((Image *)local_148,local_1ec,(Point2i)0x2000000011,channels,&local_178,
                         alloc);
      TVar7.x = 0;
      TVar7.y = 0;
      pfVar14 = local_1a0.ptr;
      do {
        local_218 = (Tuple2<pbrt::Point2,_int>)((long)TVar7 << 0x20);
        uVar11 = 0;
        local_1c0 = TVar7;
        do {
          p.super_Tuple2<pbrt::Point2,_int> = local_218 | uVar11;
          uVar13 = 0;
          do {
            pbrt::Image::SetChannel((Image *)local_148,p,uVar13,*pfVar14);
            uVar13 = uVar13 + 1;
            pfVar14 = pfVar14 + 1;
          } while (nc != uVar13);
          uVar11 = uVar11 + 1;
        } while (uVar11 != 0x11);
        TVar7 = (Tuple2<pbrt::Point2,_int>)((long)local_1c0 + 1);
      } while (TVar7 != (Tuple2<pbrt::Point2,_int>)0x20);
      local_208.pMin.super_Tuple2<pbrt::Point2,_int>.x = 10;
      local_208.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0x17;
      local_208.pMax.super_Tuple2<pbrt::Point2,_int>.x = 0x11;
      local_208.pMax.super_Tuple2<pbrt::Point2,_int>.y = 0x1c;
      std::vector<float,_std::allocator<float>_>::vector
                (&local_1b8,(long)(int)(nc * 0x23),(allocator_type *)&local_1e8);
      uVar11 = local_1c8;
      for (pFVar9 = local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pFVar9 != local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish; pFVar9 = pFVar9 + 1) {
        uVar13 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
        bVar8 = (byte)(uVar11 >> 0x3b);
        auVar16 = vcvtusi2ss_avx512f(in_ZMM3._0_16_,uVar13 >> bVar8 | uVar13 << 0x20 - bVar8);
        auVar16 = vminss_avx(ZEXT416((uint)(auVar16._0_4_ * 2.3283064e-10)),
                             SUB6416(ZEXT464(0x3f7fffff),0));
        *pFVar9 = auVar16._0_4_;
        uVar11 = uVar11 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
      }
      buf_00.n = (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
      buf_00.ptr = local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
      pbrt::Image::CopyRectIn((Image *)local_148,&local_208,buf_00);
      iVar3 = local_208.pMax.super_Tuple2<pbrt::Point2,_int>.y;
      if (local_208.pMax.super_Tuple2<pbrt::Point2,_int>.x <=
          local_208.pMin.super_Tuple2<pbrt::Point2,_int>.x ||
          local_208.pMax.super_Tuple2<pbrt::Point2,_int>.y <=
          local_208.pMin.super_Tuple2<pbrt::Point2,_int>.y) {
        iVar3 = local_208.pMin.super_Tuple2<pbrt::Point2,_int>.y;
      }
      local_1c8 = uVar11;
      if (iVar3 != local_208.pMin.super_Tuple2<pbrt::Point2,_int>.y) {
        local_218 = local_208.pMin.super_Tuple2<pbrt::Point2,_int>;
        pfVar15 = local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          local_228.ptr_._0_1_ =
               pfVar15 !=
               local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          TVar7 = local_218;
          local_1c0 = local_218;
          if (pfVar15 ==
              local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            bVar5 = true;
          }
          else {
            uVar13 = 0;
            do {
              local_220.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&local_220,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              if (local_1ec == U256) {
                FVar17 = pbrt::Image::GetChannel
                                   ((Image *)local_148,(Point2i)local_218,uVar13,
                                    (WrapMode2D)0x200000002);
                auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)*pfVar15));
                in_ZMM3 = ZEXT1664(ZEXT816(0) << 0x40);
                uVar1 = vcmpss_avx512f(ZEXT416((uint)*pfVar15),ZEXT816(0) << 0x40,1);
                auVar2._8_4_ = 0x7fffffff;
                auVar2._0_8_ = 0x7fffffff7fffffff;
                auVar2._12_4_ = 0x7fffffff;
                auVar16 = vandps_avx512vl(ZEXT416((uint)(FVar17 - (float)((uint)!(bool)((byte)uVar1
                                                                                       & 1) *
                                                                         auVar16._0_4_))),auVar2);
                local_1f8[0] = auVar16._0_4_;
                local_228.ptr_._0_4_ = 0.0019647058;
                testing::internal::CmpHelperLT<float,float>
                          ((internal *)&local_1e8,"err","0.501f / 255.f",local_1f8,
                           (float *)&local_228);
                if ((char)local_1e8._M_dataplus._M_p == '\0') {
                  testing::Message::Message((Message *)&local_228);
                  pcVar10 = "";
                  if ((undefined8 *)local_1e8._M_string_length != (undefined8 *)0x0) {
                    pcVar10 = *(char **)local_1e8._M_string_length;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_230,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                             ,0x125,pcVar10);
                  testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_228);
                  testing::internal::AssertHelper::~AssertHelper(&local_230);
                  if (local_228.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    bVar5 = testing::internal::IsTrue(true);
                    if ((bVar5) &&
                       (local_228.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0)) {
                      (**(code **)(*(long *)local_228.ptr_ + 8))();
                    }
                    local_228.ptr_ =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x0;
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_1e8._M_string_length,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
              else {
                local_1f8[0] = modelQuantization(*pfVar15,local_1ec);
                FVar17 = pbrt::Image::GetChannel
                                   ((Image *)local_148,(Point2i)local_218,uVar13,
                                    (WrapMode2D)0x200000002);
                local_228.ptr_._0_4_ = FVar17;
                testing::internal::CmpHelperEQ<float,float>
                          ((internal *)&local_1e8,"qv","image.GetChannel(*pIter, c)",local_1f8,
                           (float *)&local_228);
                if ((char)local_1e8._M_dataplus._M_p == '\0') {
                  testing::Message::Message((Message *)&local_228);
                  pcVar10 = "";
                  if ((undefined8 *)local_1e8._M_string_length != (undefined8 *)0x0) {
                    pcVar10 = *(char **)local_1e8._M_string_length;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_230,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                             ,0x128,pcVar10);
                  testing::internal::AssertHelper::operator=(&local_230,(Message *)&local_228);
                  testing::internal::AssertHelper::~AssertHelper(&local_230);
                  if (local_228.ptr_ !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    bVar5 = testing::internal::IsTrue(true);
                    if ((bVar5) &&
                       (local_228.ptr_ !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0)) {
                      (**(code **)(*(long *)local_228.ptr_ + 8))();
                    }
                    local_228.ptr_ =
                         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x0;
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_1e8._M_string_length,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
              if (local_20c == uVar13) {
                pfVar15 = pfVar15 + 1;
                uVar13 = 0x16;
                bVar5 = false;
                goto LAB_002cbe97;
              }
              pfVar15 = pfVar15 + 1;
              uVar13 = uVar13 + 1;
              local_228.ptr_._0_1_ =
                   pfVar15 !=
                   local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
            } while (pfVar15 !=
                     local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish);
            bVar5 = uVar13 < nc;
          }
          local_220.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::Message::Message((Message *)&local_230);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_1e8,(internal *)&local_228,(AssertionResult *)"bufIter == buf.end()",
                     "true","false",(char *)TVar7);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_1f8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x121,(char *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,
                                             (char)local_1e8._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_1f8,(Message *)&local_230);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1e8._M_dataplus._M_p._1_7_,(char)local_1e8._M_dataplus._M_p) !=
              &local_1e8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_1e8._M_dataplus._M_p._1_7_,
                                     (char)local_1e8._M_dataplus._M_p),
                            local_1e8.field_2._M_allocated_capacity + 1);
          }
          if (local_230.data_ != (AssertHelperData *)0x0) {
            bVar6 = testing::internal::IsTrue(true);
            if ((bVar6) && (local_230.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_230.data_ + 8))();
            }
            local_230.data_ = (AssertHelperData *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_220,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          uVar13 = 1;
LAB_002cbe97:
          if (bVar5) goto LAB_002cbf39;
          uVar13 = local_1c0.x + 1;
          uVar11 = (ulong)local_218 & 0xffffffff00000000;
          local_218 = (Tuple2<pbrt::Point2,_int>)
                      (uVar11 + 0x100000000 +
                      ((ulong)local_208.pMin.super_Tuple2<pbrt::Point2,_int> & 0xffffffff));
          if (uVar13 != local_208.pMax.super_Tuple2<pbrt::Point2,_int>.x) {
            local_218 = (Tuple2<pbrt::Point2,_int>)(uVar11 | uVar13);
          }
          iVar3 = local_208.pMax.super_Tuple2<pbrt::Point2,_int>.y;
          if (local_208.pMax.super_Tuple2<pbrt::Point2,_int>.x <=
              local_208.pMin.super_Tuple2<pbrt::Point2,_int>.x ||
              local_208.pMax.super_Tuple2<pbrt::Point2,_int>.y <=
              local_208.pMin.super_Tuple2<pbrt::Point2,_int>.y) {
            iVar3 = local_208.pMin.super_Tuple2<pbrt::Point2,_int>.y;
          }
        } while ((local_208.pMin.super_Tuple2<pbrt::Point2,_int>.x != local_218.x) ||
                (iVar3 != local_218.y));
      }
      uVar13 = 0x13;
LAB_002cbf39:
      if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (Float *)0x0) {
        operator_delete(local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_38 = 0;
      (*(local_50.memoryResource)->_vptr_memory_resource[3])
                (local_50.memoryResource,local_48,local_40 << 2,4);
      local_58 = 0;
      (*(local_70.memoryResource)->_vptr_memory_resource[3])
                (local_70.memoryResource,local_68,local_60 * 2,2);
      local_78 = 0;
      (*(local_90.memoryResource)->_vptr_memory_resource[3])
                (local_90.memoryResource,local_88,local_80,1);
      uVar11 = local_1c8;
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector(&local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_170);
      local_1a0.nStored = 0;
      (*(local_1a0.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_1a0.alloc.memoryResource,local_1a0.ptr,local_1a0.nAlloc << 2,4);
      if (uVar13 != 0x13) {
        bVar5 = (uVar13 & 0x1b) != 0;
        goto LAB_002cc065;
      }
      nc = nc + 1;
      local_20c = local_20c + 1;
    } while (nc != 4);
    bVar5 = false;
LAB_002cc065:
    if ((bVar5) || (local_180 = local_180 + 4, local_180 == 0xc)) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Image, CopyRectIn) {
    Point2i res(17, 32);
    RNG rng;

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        for (int nc = 1; nc < 4; ++nc) {
            pstd::vector<float> orig = GetFloatPixels(res, nc);

            std::vector<std::string> channelNames = {"A"};
            for (int i = 1; i < nc; ++i)
                channelNames.push_back(std::string(1, 'A' + 1));

            Image image(format, res, channelNames, ColorEncodingHandle::Linear);
            auto origIter = orig.begin();
            for (int y = 0; y < res[1]; ++y)
                for (int x = 0; x < res[0]; ++x)
                    for (int c = 0; c < nc; ++c, ++origIter)
                        image.SetChannel({x, y}, c, *origIter);

            Bounds2i extent(Point2i(10, 23), Point2i(17, 28));
            std::vector<float> buf(extent.Area() * nc);
            std::generate(buf.begin(), buf.end(),
                          [&rng]() { return rng.Uniform<Float>(); });

            image.CopyRectIn(extent, buf);

            // Iterate through the points in the extent and the buffer
            // together.
            auto bufIter = buf.begin();
            for (auto pIter = begin(extent); pIter != end(extent); ++pIter) {
                for (int c = 0; c < nc; ++c) {
                    ASSERT_FALSE(bufIter == buf.end());
                    if (format == PixelFormat::U256) {
                        Float err =
                            std::abs(image.GetChannel(*pIter, c) - Clamp(*bufIter, 0, 1));
                        EXPECT_LT(err, 0.501f / 255.f);
                    } else {
                        Float qv = modelQuantization(*bufIter, format);
                        EXPECT_EQ(qv, image.GetChannel(*pIter, c));
                    }
                    ++bufIter;
                }
            }
        }
    }
}